

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall
EmmyDebuggerManager::RemoveBreakpoint(EmmyDebuggerManager *this,string *file,int line)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  int local_6c;
  const_iterator local_60;
  undefined1 local_48 [8];
  shared_ptr<BreakPoint> bp;
  __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
  local_30;
  iterator it;
  lock_guard<std::mutex> lock;
  int line_local;
  string *file_local;
  EmmyDebuggerManager *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->breakpointsMtx);
  local_30._M_current =
       (shared_ptr<BreakPoint> *)
       std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
       begin(&this->breakpoints);
  do {
    bp.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
         end(&this->breakpoints);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
                        *)&bp.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
             ::operator*(&local_30);
    std::shared_ptr<BreakPoint>::shared_ptr((shared_ptr<BreakPoint> *)local_48,psVar2);
    peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_48);
    if (peVar3->line == line) {
      peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      bVar1 = CompareIgnoreCase(&peVar3->file,file);
      if (bVar1) goto LAB_001fb730;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<BreakPoint>const*,std::vector<std::shared_ptr<BreakPoint>,std::allocator<std::shared_ptr<BreakPoint>>>>
      ::__normal_iterator<std::shared_ptr<BreakPoint>*>
                ((__normal_iterator<std::shared_ptr<BreakPoint>const*,std::vector<std::shared_ptr<BreakPoint>,std::allocator<std::shared_ptr<BreakPoint>>>>
                  *)&local_60,&local_30);
      std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::erase
                (&this->breakpoints,local_60);
      local_6c = 3;
    }
    else {
LAB_001fb730:
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
      ::operator++(&local_30);
      local_6c = 0;
    }
    std::shared_ptr<BreakPoint>::~shared_ptr((shared_ptr<BreakPoint> *)local_48);
  } while (local_6c == 0);
  RefreshLineSet(this);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return;
}

Assistant:

void EmmyDebuggerManager::RemoveBreakpoint(const std::string& file, int line)
{
	std::lock_guard<std::mutex> lock(breakpointsMtx);
	auto it = breakpoints.begin();
	while (it != breakpoints.end())
	{
		const auto bp = *it;
		if (bp->line == line && CompareIgnoreCase(bp->file, file) == 0)
		{
			breakpoints.erase(it);
			break;
		}
		++it;
	}
	RefreshLineSet();
}